

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_dump_listener.c
# Opt level: O3

HT_FileDumpListener *
ht_file_dump_listener_create(char *filename,size_t buffer_size,HT_ErrorCode *out_err)

{
  HT_ErrorCode HVar1;
  HT_FileDumpListener *buffer;
  FILE *pFVar2;
  HT_Mutex *pHVar3;
  
  buffer = (HT_FileDumpListener *)ht_alloc(0x28);
  if (buffer == (HT_FileDumpListener *)0x0) {
    HVar1 = HT_ERR_OUT_OF_MEMORY;
  }
  else {
    pFVar2 = fopen(filename,"wb");
    buffer->p_file = (FILE *)pFVar2;
    if (pFVar2 == (FILE *)0x0) {
      HVar1 = HT_ERR_CANT_OPEN_FILE;
    }
    else {
      pHVar3 = ht_mutex_create();
      buffer->mtx = pHVar3;
      if (pHVar3 == (HT_Mutex *)0x0) {
        HVar1 = HT_ERR_OUT_OF_MEMORY;
      }
      else {
        HVar1 = ht_listener_buffer_init((HT_ListenerBuffer *)buffer,buffer_size);
        if (HVar1 == HT_ERR_OK) {
          ht_timeline_listener_push_metadata(ht_file_dump_listener_callback,buffer,1);
          HVar1 = HT_ERR_OK;
          goto LAB_00109614;
        }
        ht_mutex_destroy(buffer->mtx);
      }
      fclose((FILE *)buffer->p_file);
    }
    ht_free(buffer);
  }
  buffer = (HT_FileDumpListener *)0x0;
LAB_00109614:
  if (out_err != (HT_ErrorCode *)0x0) {
    *out_err = HVar1;
  }
  return buffer;
}

Assistant:

HT_FileDumpListener*
ht_file_dump_listener_create(const char* filename, size_t buffer_size, HT_ErrorCode* out_err)
{
    HT_ErrorCode error_code = HT_ERR_OK;
    HT_FileDumpListener* listener = HT_CREATE_TYPE(HT_FileDumpListener);

    if (listener == NULL)
    {
        error_code = HT_ERR_OUT_OF_MEMORY;
        goto done;
    }

    listener->p_file = fopen(filename, "wb");
    if (listener->p_file == NULL)
    {
        error_code = HT_ERR_CANT_OPEN_FILE;
        goto error_open_file;
    }

    listener->mtx = ht_mutex_create();
    if (listener->mtx == NULL)
    {
        error_code = HT_ERR_OUT_OF_MEMORY;
        goto error_create_mutex;
    }

    error_code = ht_listener_buffer_init(&listener->buffer, buffer_size);
    if (error_code != HT_ERR_OK)
    {
        ht_mutex_destroy(listener->mtx);
    }
    else
    {
        ht_timeline_listener_push_metadata(ht_file_dump_listener_callback, listener, HT_TRUE);
        goto done;
    }

error_create_mutex:
    fclose(listener->p_file);

error_open_file:
    ht_free(listener);
    listener = NULL;

done:
    HT_SET_ERROR(out_err, error_code);

    return listener;
}